

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O2

void poly1305_blocks(poly1305_state_internal *st,uint8_t *m,size_t bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  uint64_t uVar35;
  ulong uVar36;
  ulong uVar37;
  uint64_t uVar38;
  ulong uVar39;
  uint64_t uVar40;
  ulong uVar41;
  uint64_t uVar42;
  uint64_t uVar43;
  ulong uVar44;
  uint64_t uVar45;
  ulong uVar46;
  uint64_t uVar47;
  ulong uVar48;
  ulong uVar49;
  uint64_t uVar50;
  ulong uVar51;
  uint64_t uVar52;
  ulong uVar53;
  uint64_t uVar54;
  ulong uVar55;
  ulong uVar56;
  
  uVar35 = (st->field_1).HH[0];
  uVar38 = (st->field_1).HH[1];
  uVar52 = (st->field_1).HH[2];
  uVar54 = (st->field_1).HH[3];
  uVar40 = (st->field_1).HH[4];
  uVar42 = (st->field_1).HH[5];
  uVar43 = (st->field_1).HH[6];
  uVar45 = (st->field_1).HH[7];
  uVar47 = (st->field_1).HH[8];
  uVar50 = (st->field_1).HH[9];
  for (; 0x3f < bytes; bytes = bytes - 0x40) {
    uVar39 = st->P[0].R20.u[0];
    uVar41 = st->P[0].R20.u[1];
    uVar44 = st->P[0].R21.u[0];
    uVar1 = st->P[0].R21.u[1];
    uVar2 = st->P[0].R22.u[0];
    uVar3 = st->P[0].R22.u[1];
    uVar27 = st->P[0].R23.u[0];
    uVar28 = st->P[0].R23.u[1];
    uVar4 = st->P[0].S24.u[0];
    uVar5 = st->P[0].S24.u[1];
    uVar6 = st->P[0].S23.u[0];
    uVar7 = st->P[0].S23.u[1];
    uVar29 = st->P[0].S22.u[0];
    uVar30 = st->P[0].S22.u[1];
    uVar34 = *(ulong *)((long)m + 0x10);
    uVar37 = *(ulong *)m;
    uVar21 = *(ulong *)((long)m + 8);
    uVar31 = uVar37 & 0x3ffffff;
    uVar32 = uVar34 & 0x3ffffff;
    uVar51 = uVar37 >> 0x1a & 0x3ffffff;
    uVar53 = uVar34 >> 0x1a & 0x3ffffff;
    uVar48 = *(ulong *)((long)m + 0x18) << 0xc;
    uVar55 = uVar21 << 0xc & 0x3ffffff | uVar37 >> 0x34;
    uVar56 = uVar48 & 0x3ffffff | uVar34 >> 0x34;
    uVar46 = (uVar21 << 0xc) >> 0x1a & 0x3ffffff;
    uVar49 = uVar48 >> 0x1a & 0x3ffffff;
    uVar36 = *(ulong *)((long)m + 0x18) >> 0x28;
    uVar33 = (uint)(uVar21 >> 0x28) | 0x1000000;
    uVar48 = st->P[1].R20.u[0];
    uVar8 = st->P[1].R20.u[1];
    uVar9 = st->P[1].S24.u[0];
    uVar10 = st->P[1].S24.u[1];
    uVar11 = st->P[1].S22.u[0];
    uVar12 = st->P[1].S22.u[1];
    uVar13 = st->P[1].S23.u[0];
    uVar14 = st->P[1].S23.u[1];
    uVar15 = st->P[1].R21.u[0];
    uVar16 = st->P[1].R21.u[1];
    uVar17 = st->P[1].R22.u[0];
    uVar18 = st->P[1].R22.u[1];
    uVar19 = st->P[1].R23.u[0];
    uVar20 = st->P[1].R23.u[1];
    uVar34 = *(ulong *)((long)m + 0x30);
    uVar37 = *(ulong *)((long)m + 0x20);
    uVar21 = (uVar37 & 0x3ffffff) +
             (uVar11 & 0xffffffff) * uVar46 +
             (uVar13 & 0xffffffff) * uVar55 +
             (uVar9 & 0xffffffff) * uVar51 +
             (uVar48 & 0xffffffff) * uVar31 +
             (st->P[0].S21.u[0] & 0xffffffff) * (uVar47 & 0xffffffff) +
             (uVar29 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar6 & 0xffffffff) * (uVar40 & 0xffffffff) +
             (uVar4 & 0xffffffff) * (uVar52 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar35 & 0xffffffff) +
             (st->P[1].S21.u[0] & 0xffffffff) * (uVar21 >> 0x28 | 0x1000000);
    uVar22 = (uVar34 & 0x3ffffff) +
             (uVar12 & 0xffffffff) * uVar49 +
             (uVar14 & 0xffffffff) * uVar56 +
             (uVar10 & 0xffffffff) * uVar53 +
             (uVar8 & 0xffffffff) * uVar32 +
             (st->P[0].S21.u[1] & 0xffffffff) * (uVar50 & 0xffffffff) +
             (uVar30 & 0xffffffff) * (uVar45 & 0xffffffff) +
             (uVar7 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar5 & 0xffffffff) * (uVar54 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar38 & 0xffffffff) +
             (st->P[1].S21.u[1] & 0xffffffff) * (uVar36 | 0x1000000);
    uVar23 = *(ulong *)((long)m + 0x28) << 0xc;
    uVar25 = *(ulong *)((long)m + 0x38) << 0xc;
    uVar24 = (uVar23 >> 0x1a & 0x3ffffff) +
             (uVar9 & 0xffffffff) * (ulong)uVar33 + (uVar17 & 0xffffffff) * uVar51 +
             (uVar19 & 0xffffffff) * uVar31 +
             uVar46 * (uVar48 & 0xffffffff) +
             uVar55 * (uVar15 & 0xffffffff) +
             (uVar4 & 0xffffffff) * (uVar47 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar44 & 0xffffffff) * (uVar40 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar52 & 0xffffffff) +
             (uVar27 & 0xffffffff) * (uVar35 & 0xffffffff);
    uVar26 = (uVar25 >> 0x1a & 0x3ffffff) +
             (uVar10 & 0xffffffff) * (uVar36 | 0x1000000) + (uVar18 & 0xffffffff) * uVar53 +
             (uVar20 & 0xffffffff) * uVar32 +
             uVar49 * (uVar8 & 0xffffffff) +
             uVar56 * (uVar16 & 0xffffffff) +
             (uVar5 & 0xffffffff) * (uVar50 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar45 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar54 & 0xffffffff) +
             (uVar28 & 0xffffffff) * (uVar38 & 0xffffffff);
    uVar29 = (uVar21 >> 0x1a) +
             (uVar37 >> 0x1a & 0x3ffffff) +
             (uVar11 & 0xffffffff) * (ulong)uVar33 + (uVar13 & 0xffffffff) * uVar46 +
             (uVar9 & 0xffffffff) * uVar55 +
             (uVar48 & 0xffffffff) * uVar51 +
             (uVar29 & 0xffffffff) * (uVar47 & 0xffffffff) +
             (uVar6 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar4 & 0xffffffff) * (uVar40 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar52 & 0xffffffff) +
             (uVar44 & 0xffffffff) * (uVar35 & 0xffffffff) + (uVar15 & 0xffffffff) * uVar31;
    uVar30 = (uVar22 >> 0x1a) +
             (uVar34 >> 0x1a & 0x3ffffff) +
             (uVar12 & 0xffffffff) * (uVar36 | 0x1000000) + (uVar14 & 0xffffffff) * uVar49 +
             (uVar10 & 0xffffffff) * uVar56 +
             (uVar8 & 0xffffffff) * uVar53 +
             (uVar30 & 0xffffffff) * (uVar50 & 0xffffffff) +
             (uVar7 & 0xffffffff) * (uVar45 & 0xffffffff) +
             (uVar5 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar54 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar38 & 0xffffffff) + (uVar16 & 0xffffffff) * uVar32;
    uVar27 = (uVar24 >> 0x1a) + 0x1000000 +
             (*(ulong *)((long)m + 0x28) >> 0x28) +
             (ulong)uVar33 * (uVar48 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar47 & 0xffffffff) +
             (uVar44 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar40 & 0xffffffff) +
             (uVar27 & 0xffffffff) * (uVar52 & 0xffffffff) +
             (uVar35 & 0xffffffff) * (ulong)st->P[0].R24.d[0] + uVar55 * (uVar17 & 0xffffffff) +
             uVar46 * (uVar15 & 0xffffffff) + uVar51 * (uVar19 & 0xffffffff) +
             uVar31 * st->P[1].R24.d[0];
    uVar28 = (uVar26 >> 0x1a) + 0x1000000 +
             (*(ulong *)((long)m + 0x38) >> 0x28) +
             (uVar36 | 0x1000000) * (uVar8 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar50 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar45 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar28 & 0xffffffff) * (uVar54 & 0xffffffff) +
             (uVar38 & 0xffffffff) * (ulong)st->P[0].R24.d[2] + uVar56 * (uVar18 & 0xffffffff) +
             uVar49 * (uVar16 & 0xffffffff) + uVar53 * (uVar20 & 0xffffffff) +
             uVar32 * st->P[1].R24.d[2];
    uVar39 = (uVar29 >> 0x1a) +
             (uVar23 & 0x3ffffff | uVar37 >> 0x34) +
             (uVar13 & 0xffffffff) * (ulong)uVar33 + (uVar17 & 0xffffffff) * uVar31 +
             uVar46 * (uVar9 & 0xffffffff) +
             uVar55 * (uVar48 & 0xffffffff) +
             (uVar15 & 0xffffffff) * uVar51 +
             (uVar6 & 0xffffffff) * (uVar47 & 0xffffffff) +
             (uVar4 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar35 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar40 & 0xffffffff) +
             (uVar44 & 0xffffffff) * (uVar52 & 0xffffffff);
    uVar41 = (uVar30 >> 0x1a) +
             (uVar25 & 0x3ffffff | uVar34 >> 0x34) +
             (uVar14 & 0xffffffff) * (uVar36 | 0x1000000) + (uVar18 & 0xffffffff) * uVar32 +
             uVar49 * (uVar10 & 0xffffffff) +
             uVar56 * (uVar8 & 0xffffffff) +
             (uVar16 & 0xffffffff) * uVar53 +
             (uVar7 & 0xffffffff) * (uVar50 & 0xffffffff) +
             (uVar5 & 0xffffffff) * (uVar45 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar38 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar54 & 0xffffffff);
    uVar34 = (uVar27 >> 0x1a & 0xffffffff) * 5 + (uVar21 & 0x3ffffff);
    uVar37 = (uVar28 >> 0x1a & 0xffffffff) * 5 + (uVar22 & 0x3ffffff);
    uVar21 = (uVar39 >> 0x1a) + (uVar24 & 0x3ffffff);
    uVar44 = (uVar41 >> 0x1a) + (uVar26 & 0x3ffffff);
    uVar52 = (uVar34 >> 0x1a) + (uVar29 & 0x3ffffff);
    uVar54 = (uVar37 >> 0x1a) + (uVar30 & 0x3ffffff);
    uVar47 = (uVar21 >> 0x1a) + (uVar27 & 0x3ffffff);
    uVar50 = (uVar44 >> 0x1a) + (uVar28 & 0x3ffffff);
    uVar40 = uVar39 & 0x3ffffff;
    uVar42 = uVar41 & 0x3ffffff;
    uVar35 = uVar34 & 0x3ffffff;
    uVar38 = uVar37 & 0x3ffffff;
    uVar43 = uVar21 & 0x3ffffff;
    uVar45 = uVar44 & 0x3ffffff;
    m = (uint8_t *)((long)m + 0x40);
  }
  (st->field_1).HH[0] = uVar35;
  (st->field_1).HH[1] = uVar38;
  (st->field_1).HH[2] = uVar52;
  (st->field_1).HH[3] = uVar54;
  (st->field_1).HH[4] = uVar40;
  (st->field_1).HH[5] = uVar42;
  (st->field_1).HH[6] = uVar43;
  (st->field_1).HH[7] = uVar45;
  (st->field_1).HH[8] = uVar47;
  (st->field_1).HH[9] = uVar50;
  return;
}

Assistant:

static void poly1305_blocks(poly1305_state_internal *st, const uint8_t *m,
                            size_t bytes) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);

  poly1305_power *p;
  xmmi H0, H1, H2, H3, H4;
  xmmi T0, T1, T2, T3, T4, T5, T6;
  xmmi M0, M1, M2, M3, M4;
  xmmi C1, C2;

  H0 = st->H[0];
  H1 = st->H[1];
  H2 = st->H[2];
  H3 = st->H[3];
  H4 = st->H[4];

  while (bytes >= 64) {
    // H *= [r^4,r^4]
    p = &st->P[0];
    T0 = _mm_mul_epu32(H0, p->R20.v);
    T1 = _mm_mul_epu32(H0, p->R21.v);
    T2 = _mm_mul_epu32(H0, p->R22.v);
    T3 = _mm_mul_epu32(H0, p->R23.v);
    T4 = _mm_mul_epu32(H0, p->R24.v);
    T5 = _mm_mul_epu32(H1, p->S24.v);
    T6 = _mm_mul_epu32(H1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H2, p->S23.v);
    T6 = _mm_mul_epu32(H2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H3, p->S22.v);
    T6 = _mm_mul_epu32(H3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H4, p->S21.v);
    T6 = _mm_mul_epu32(H4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H1, p->R21.v);
    T6 = _mm_mul_epu32(H1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H2, p->R20.v);
    T6 = _mm_mul_epu32(H2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H3, p->S24.v);
    T6 = _mm_mul_epu32(H3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H4, p->S23.v);
    T6 = _mm_mul_epu32(H4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]*[r^2,r^2]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                            _mm_loadl_epi64((const xmmi *)(m + 16)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                            _mm_loadl_epi64((const xmmi *)(m + 24)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    p = &st->P[1];
    T5 = _mm_mul_epu32(M0, p->R20.v);
    T6 = _mm_mul_epu32(M0, p->R21.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M1, p->S24.v);
    T6 = _mm_mul_epu32(M1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M2, p->S23.v);
    T6 = _mm_mul_epu32(M2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M3, p->S22.v);
    T6 = _mm_mul_epu32(M3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M4, p->S21.v);
    T6 = _mm_mul_epu32(M4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M0, p->R22.v);
    T6 = _mm_mul_epu32(M0, p->R23.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M1, p->R21.v);
    T6 = _mm_mul_epu32(M1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M2, p->R20.v);
    T6 = _mm_mul_epu32(M2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M3, p->S24.v);
    T6 = _mm_mul_epu32(M3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M4, p->S23.v);
    T6 = _mm_mul_epu32(M4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M0, p->R24.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 32)),
                            _mm_loadl_epi64((const xmmi *)(m + 48)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 40)),
                            _mm_loadl_epi64((const xmmi *)(m + 56)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    T0 = _mm_add_epi64(T0, M0);
    T1 = _mm_add_epi64(T1, M1);
    T2 = _mm_add_epi64(T2, M2);
    T3 = _mm_add_epi64(T3, M3);
    T4 = _mm_add_epi64(T4, M4);

    // reduce
    C1 = _mm_srli_epi64(T0, 26);
    C2 = _mm_srli_epi64(T3, 26);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_and_si128(T3, MMASK);
    T1 = _mm_add_epi64(T1, C1);
    T4 = _mm_add_epi64(T4, C2);
    C1 = _mm_srli_epi64(T1, 26);
    C2 = _mm_srli_epi64(T4, 26);
    T1 = _mm_and_si128(T1, MMASK);
    T4 = _mm_and_si128(T4, MMASK);
    T2 = _mm_add_epi64(T2, C1);
    T0 = _mm_add_epi64(T0, _mm_mul_epu32(C2, FIVE));
    C1 = _mm_srli_epi64(T2, 26);
    C2 = _mm_srli_epi64(T0, 26);
    T2 = _mm_and_si128(T2, MMASK);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_add_epi64(T3, C1);
    T1 = _mm_add_epi64(T1, C2);
    C1 = _mm_srli_epi64(T3, 26);
    T3 = _mm_and_si128(T3, MMASK);
    T4 = _mm_add_epi64(T4, C1);

    // H = (H*[r^4,r^4] + [Mx,My]*[r^2,r^2] + [Mx,My])
    H0 = T0;
    H1 = T1;
    H2 = T2;
    H3 = T3;
    H4 = T4;

    m += 64;
    bytes -= 64;
  }

  st->H[0] = H0;
  st->H[1] = H1;
  st->H[2] = H2;
  st->H[3] = H3;
  st->H[4] = H4;
}